

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

void __thiscall
flatbuffers::FlatCompiler::AnnotateBinaries
          (FlatCompiler *this,uint8_t *binary_schema,uint64_t binary_schema_size,
          FlatCOptions *options)

{
  size_type binary_length;
  bool bVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  pointer __rhs;
  string binary_contents;
  Options text_gen_opts;
  BinaryAnnotator binary_annotator;
  AnnotatedBinaryTextGenerator text_generator;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  annotations;
  string local_288;
  string local_268;
  string *local_248;
  FlatCompiler *local_240;
  uint8_t *local_238;
  uint64_t local_230;
  pointer local_228;
  Options local_220;
  BinaryAnnotator local_1d0;
  AnnotatedBinaryTextGenerator local_120;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  local_60;
  
  __rhs = (options->filenames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_228 = (options->filenames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != local_228) {
    local_248 = &options->annotate_schema;
    local_240 = this;
    local_238 = binary_schema;
    local_230 = binary_schema_size;
    do {
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
      bVar1 = LoadFile((__rhs->_M_dataplus)._M_p,true,&local_288);
      binary_length = local_288._M_string_length;
      _Var3._M_p = local_288._M_dataplus._M_p;
      if (bVar1) {
        BinaryAnnotator::BinaryAnnotator
                  (&local_1d0,local_238,local_230,(uint8_t *)local_288._M_dataplus._M_p,
                   local_288._M_string_length,(options->opts).size_prefixed);
        BinaryAnnotator::Annotate
                  ((map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                    *)&local_90,&local_1d0);
        local_220.max_bytes_per_line = 8;
        local_220.output_postfix._M_dataplus._M_p = (pointer)&local_220.output_postfix.field_2;
        local_220.output_postfix._M_string_length = 0;
        local_220.output_postfix.field_2._M_local_buf[0] = '\0';
        local_220.output_extension._M_dataplus._M_p = (pointer)&local_220.output_extension.field_2;
        local_220.output_extension.field_2._M_local_buf[2] = 'b';
        local_220.output_extension.field_2._M_allocated_capacity._0_2_ = 0x6661;
        local_220.output_extension._M_string_length = 3;
        local_220.output_extension.field_2._M_local_buf[3] = '\0';
        local_220.include_vector_contents = options->annotate_include_vector_contents;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
        ::_Rb_tree(&local_60,&local_90);
        AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
                  (&local_120,&local_220,
                   (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                    *)&local_60,(uint8_t *)_Var3._M_p,binary_length);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
        ::~_Rb_tree(&local_60);
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
        AnnotatedBinaryTextGenerator::Generate(&local_120,__rhs,local_248,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.options_.output_extension._M_dataplus._M_p !=
            &local_120.options_.output_extension.field_2) {
          operator_delete(local_120.options_.output_extension._M_dataplus._M_p,
                          local_120.options_.output_extension.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.options_.output_postfix._M_dataplus._M_p !=
            &local_120.options_.output_postfix.field_2) {
          operator_delete(local_120.options_.output_postfix._M_dataplus._M_p,
                          local_120.options_.output_postfix.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.output_extension._M_dataplus._M_p != &local_220.output_extension.field_2) {
          operator_delete(local_220.output_extension._M_dataplus._M_p,
                          CONCAT44(local_220.output_extension.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_220.output_extension.field_2._M_local_buf[3],
                                            CONCAT12(local_220.output_extension.field_2._M_local_buf
                                                     [2],local_220.output_extension.field_2.
                                                         _M_allocated_capacity._0_2_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.output_postfix._M_dataplus._M_p != &local_220.output_postfix.field_2) {
          operator_delete(local_220.output_postfix._M_dataplus._M_p,
                          CONCAT71(local_220.output_postfix.field_2._M_allocated_capacity._1_7_,
                                   local_220.output_postfix.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
        ::~_Rb_tree(&local_1d0.sections_._M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
        ::~_Rb_tree(&local_1d0.vtables_._M_t);
        uVar2 = local_1d0.root_table_.field_2._M_allocated_capacity;
        _Var3._M_p = local_1d0.root_table_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0.root_table_._M_dataplus._M_p != &local_1d0.root_table_.field_2) {
LAB_002ffcef:
          operator_delete(_Var3._M_p,(ulong)(uVar2 + 1));
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,"unable to load binary file: ",__rhs);
        (*(local_240->params_).warn_fn)(local_240,(string *)&local_1d0,true);
        uVar2 = local_1d0.schema_;
        _Var3._M_p = (pointer)local_1d0.bfbs_;
        if ((Schema **)local_1d0.bfbs_ != &local_1d0.schema_) goto LAB_002ffcef;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != local_228);
  }
  return;
}

Assistant:

void FlatCompiler::AnnotateBinaries(const uint8_t *binary_schema,
                                    const uint64_t binary_schema_size,
                                    const FlatCOptions &options) {
  const std::string &schema_filename = options.annotate_schema;

  for (const std::string &filename : options.filenames) {
    std::string binary_contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &binary_contents)) {
      Warn("unable to load binary file: " + filename);
      continue;
    }

    const uint8_t *binary =
        reinterpret_cast<const uint8_t *>(binary_contents.c_str());
    const size_t binary_size = binary_contents.size();
    const bool is_size_prefixed = options.opts.size_prefixed;

    flatbuffers::BinaryAnnotator binary_annotator(
        binary_schema, binary_schema_size, binary, binary_size,
        is_size_prefixed);

    auto annotations = binary_annotator.Annotate();

    flatbuffers::AnnotatedBinaryTextGenerator::Options text_gen_opts;
    text_gen_opts.include_vector_contents =
        options.annotate_include_vector_contents;

    // TODO(dbaileychess): Right now we just support a single text-based
    // output of the annotated binary schema, which we generate here. We
    // could output the raw annotations instead and have third-party tools
    // use them to generate their own output.
    flatbuffers::AnnotatedBinaryTextGenerator text_generator(
        text_gen_opts, annotations, binary, binary_size);

    text_generator.Generate(filename, schema_filename);
  }
}